

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O1

size_t FindFirstOfSet(string *where_from,size_t pos,char *delim)

{
  char cVar1;
  size_t sVar2;
  ulong uVar3;
  uint uVar4;
  
  do {
    uVar3 = pos;
    uVar4 = 0;
    do {
      cVar1 = delim[uVar4];
      if (cVar1 == (where_from->_M_dataplus)._M_p[uVar3]) break;
      uVar4 = uVar4 + 1;
    } while (cVar1 != '\0');
    if ((cVar1 != '\0') || (pos = uVar3 + 1, where_from->_M_string_length <= uVar3)) {
      sVar2 = 0xffffffffffffffff;
      if (uVar3 != where_from->_M_string_length) {
        sVar2 = uVar3;
      }
      return sVar2;
    }
  } while( true );
}

Assistant:

size_t FindFirstOfSet(const std::string& where_from, size_t pos, const char* delim)
{ 
    while ((!ChrCmp(where_from[pos], delim)) && (pos < where_from.size()))
        pos++;
    
    if (pos == where_from.size())
        return std::string::npos;
    else
        return pos;
}